

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall Catch::JsonValueWriter::writeImpl(JsonValueWriter *this,StringRef value,bool quote)

{
  char cVar1;
  undefined7 in_register_00000009;
  char *pcVar2;
  size_type sVar3;
  
  if ((int)CONCAT71(in_register_00000009,quote) != 0) {
    std::operator<<(this->m_os,'\"');
  }
  sVar3 = 0;
  do {
    if (value.m_size == sVar3) {
      if (!quote) {
        return;
      }
      std::operator<<(this->m_os,'\"');
      return;
    }
    cVar1 = value.m_start[sVar3];
    switch(cVar1) {
    case '\b':
      pcVar2 = "\\b";
      break;
    case '\t':
      pcVar2 = "\\t";
      break;
    case '\n':
      pcVar2 = "\\n";
      break;
    case '\v':
switchD_0013b659_caseD_b:
      std::operator<<(this->m_os,cVar1);
      goto LAB_0013b6ad;
    case '\f':
      pcVar2 = "\\f";
      break;
    case '\r':
      pcVar2 = "\\r";
      break;
    default:
      if (cVar1 == '\\') {
        pcVar2 = "\\\\";
      }
      else {
        if (cVar1 != '\"') goto switchD_0013b659_caseD_b;
        pcVar2 = "\\\"";
      }
    }
    std::operator<<(this->m_os,pcVar2);
LAB_0013b6ad:
    sVar3 = sVar3 + 1;
  } while( true );
}

Assistant:

void JsonValueWriter::writeImpl( Catch::StringRef value, bool quote ) {
        if ( quote ) { m_os << '"'; }
        for (char c : value) {
            // Escape list taken from https://www.json.org/json-en.html,
            // string definition.
            // Note that while forward slash _can_ be escaped, it does
            // not have to be, if JSON is not further embedded somewhere
            // where forward slash is meaningful.
            if ( c == '"' ) {
                m_os << "\\\"";
            } else if ( c == '\\' ) {
                m_os << "\\\\";
            } else if ( c == '\b' ) {
                m_os << "\\b";
            } else if ( c == '\f' ) {
                m_os << "\\f";
            } else if ( c == '\n' ) {
                m_os << "\\n";
            } else if ( c == '\r' ) {
                m_os << "\\r";
            } else if ( c == '\t' ) {
                m_os << "\\t";
            } else {
                m_os << c;
            }
        }
        if ( quote ) { m_os << '"'; }
    }